

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O1

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,Recycler *alloc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  uchar *puVar5;
  Type *addr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->m_contentSize = size;
  (this->m_content).ptr = (uchar *)0x0;
  local_50 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3539b90;
  data.filename._0_4_ = 0x1d;
  data.plusSize = (ulong)size;
  this_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_50);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    puVar5 = &DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007f7521;
      *puVar4 = 0;
    }
    puVar5 = (uchar *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                (this_00,(ulong)size);
    if (puVar5 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_007f7521:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  addr = &this->m_content;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = puVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

ByteBlock(uint size, Recycler *alloc) : m_contentSize(size), m_content(nullptr)
        {
            // The New function below will copy over a buffer into this so
            // we don't need to zero it out
            m_content = RecyclerNewArrayLeaf(alloc, byte, size);
        }